

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::SubroutineArgumentAliasing4<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SubroutineArgumentAliasing4<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  test_var_type tVar1;
  int iVar2;
  long *plVar3;
  TestError *this_00;
  long lVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  string function_use;
  string iteration_loop_end;
  string iteration_loop_start;
  string verification;
  string function_definition;
  long *local_128;
  long local_118;
  long lStack_110;
  SubroutineArgumentAliasing4<glcts::ArraysOfArrays::Interface::GL> *local_108;
  TestShaderType local_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  string local_78;
  string local_58;
  long local_38;
  
  local_b8[0] = local_a8;
  local_108 = this;
  local_fc = tested_shader_type;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,
             "                        }\n                    }\n                }\n            }\n        }\n    }\n"
             ,"");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,
             "    for (uint a = 0u; a < 2u; a++)\n    {\n        for (uint b = 0u; b < 2u; b++)\n        {\n            for (uint c = 0u; c < 2u; c++)\n            {\n                for (uint d = 0u; d < 2u; d++)\n                {\n                    for (uint e = 0u; e < 2u; e++)\n                    {\n                        for (uint f = 0u; f < 2u; f++)\n                        {\n"
             ,"");
  lVar7 = 0;
  do {
    if (supported_variable_types_map._16_8_ == 0) {
LAB_00b693fd:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x28e8);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    tVar1 = test_shader_compilation::var_types_set_gl[lVar7];
    lVar6 = 0x21e5b78;
    lVar4 = supported_variable_types_map._16_8_;
    do {
      if ((int)tVar1 <= *(int *)(lVar4 + 0x20)) {
        lVar6 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)(*(int *)(lVar4 + 0x20) < (int)tVar1) * 8);
    } while (lVar4 != 0);
    if ((lVar6 == 0x21e5b78) || ((int)tVar1 < *(int *)(lVar6 + 0x20))) goto LAB_00b693fd;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_38 = lVar7;
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append((char *)&local_58,*(ulong *)(lVar6 + 0x28));
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append((char *)&local_58,*(ulong *)(lVar6 + 0x28));
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append((char *)&local_58,*(ulong *)(lVar6 + 0x28));
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append((char *)&local_58,*(ulong *)(lVar6 + 0x28));
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_98[0]);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar6 + 0x28);
    std::operator+(&local_f8,"                                   y[a][b][c][d][e][f] = ",__rhs);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_118 = *plVar5;
      lStack_110 = plVar3[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar5;
      local_128 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_128);
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_b8[0]);
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_98[0]);
    std::__cxx11::string::append((char *)&local_58);
    iVar2 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar2 == 0) {
      std::__cxx11::string::append((char *)&local_58);
LAB_00b68ed1:
      std::__cxx11::string::append((char *)&local_58);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        std::__cxx11::string::append((char *)&local_58);
        goto LAB_00b68ed1;
      }
      std::__cxx11::string::append((char *)&local_58);
      std::__cxx11::string::_M_append((char *)&local_58,*(ulong *)(lVar6 + 0x28));
    }
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_b8[0]);
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append((char *)&local_58,*(ulong *)(lVar6 + 0x28));
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append((char *)&local_58,*(ulong *)(lVar6 + 0x28));
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_98[0]);
    std::operator+(&local_f8,"                                   y[a][b][c][d][e][f] = ",__rhs);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_118 = *plVar5;
      lStack_110 = plVar3[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar5;
      local_128 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_128);
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_b8[0]);
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_98[0]);
    std::__cxx11::string::append((char *)&local_58);
    iVar2 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar2 == 0) {
      std::__cxx11::string::append((char *)&local_58);
LAB_00b690e4:
      std::__cxx11::string::append((char *)&local_58);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        std::__cxx11::string::append((char *)&local_58);
        goto LAB_00b690e4;
      }
      std::__cxx11::string::append((char *)&local_58);
      std::__cxx11::string::_M_append((char *)&local_58,*(ulong *)(lVar6 + 0x28));
    }
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_b8[0]);
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::append((char *)&local_58);
    std::operator+(&local_f8,"    ",__rhs);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_118 = *plVar5;
      lStack_110 = plVar3[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar5;
      local_128 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_128);
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_98[0]);
    std::__cxx11::string::append((char *)&local_d8);
    std::__cxx11::string::_M_append((char *)&local_d8,*(ulong *)(lVar6 + 0x28));
    std::__cxx11::string::append((char *)&local_d8);
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8[0]);
    std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)local_78._M_string_length,0x1ad6d49)
    ;
    if (local_fc == COMPUTE_SHADER_TYPE) {
      SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_dispatch_test
                (&local_108->super_SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 COMPUTE_SHADER_TYPE,&local_58,&local_d8,&local_78,false,false);
      SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_dispatch_test
                (&local_108->super_SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 COMPUTE_SHADER_TYPE,&local_58,&local_d8,&local_78,true,false);
    }
    else {
      SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_draw_test
                (&local_108->super_SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 local_fc,&local_58,&local_d8,&local_78,false,false);
      SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_draw_test
                (&local_108->super_SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 local_fc,&local_58,&local_d8,&local_78,true,false);
    }
    (*(local_108->super_SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
      _vptr_TestNode[5])();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    lVar7 = local_38 + 1;
    if (lVar7 == 0xf) {
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void SubroutineArgumentAliasing4<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT,   VAR_TYPE_FLOAT, VAR_TYPE_IVEC2,
															 VAR_TYPE_IVEC3, VAR_TYPE_IVEC4, VAR_TYPE_VEC2,
															 VAR_TYPE_VEC3,  VAR_TYPE_VEC4,  VAR_TYPE_MAT2,
															 VAR_TYPE_MAT3,  VAR_TYPE_MAT4 };
	static const size_t num_var_types_es = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT,   VAR_TYPE_FLOAT, VAR_TYPE_IVEC2,
															 VAR_TYPE_IVEC3, VAR_TYPE_IVEC4, VAR_TYPE_VEC2,
															 VAR_TYPE_VEC3,  VAR_TYPE_VEC4,  VAR_TYPE_MAT2,
															 VAR_TYPE_MAT3,  VAR_TYPE_MAT4,  VAR_TYPE_DOUBLE,
															 VAR_TYPE_DMAT2, VAR_TYPE_DMAT3, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string iteration_loop_end = "                        }\n"
										   "                    }\n"
										   "                }\n"
										   "            }\n"
										   "        }\n"
										   "    }\n";
	const std::string iteration_loop_start = "    for (uint a = 0u; a < 2u; a++)\n"
											 "    {\n"
											 "        for (uint b = 0u; b < 2u; b++)\n"
											 "        {\n"
											 "            for (uint c = 0u; c < 2u; c++)\n"
											 "            {\n"
											 "                for (uint d = 0u; d < 2u; d++)\n"
											 "                {\n"
											 "                    for (uint e = 0u; e < 2u; e++)\n"
											 "                    {\n"
											 "                        for (uint f = 0u; f < 2u; f++)\n"
											 "                        {\n";
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;
	const bool					test_compute  = (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type);

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string function_definition;
			std::string function_use;
			std::string verification;

			function_definition += "// Subroutine types\n"
								   "subroutine bool out_routine_type(";
			function_definition += var_iterator->second.type;
			function_definition += " x[2][2][2][2][2][2], out ";
			function_definition += var_iterator->second.type;
			function_definition += " y[2][2][2][2][2][2]);\n\n"
								   "// Subroutine definitions\n"
								   "subroutine(out_routine_type) bool original_routine(";
			function_definition += var_iterator->second.type;
			function_definition += " x[2][2][2][2][2][2], out ";
			function_definition += var_iterator->second.type;
			function_definition += " y[2][2][2][2][2][2])\n{\n";
			function_definition += iteration_loop_start;
			function_definition +=
				"                                   y[a][b][c][d][e][f] = " + var_iterator->second.type + "(123);\n";
			function_definition += iteration_loop_end;
			function_definition += "\n";
			function_definition += iteration_loop_start;
			function_definition += "                                   if(x[a][b][c][d][e][f]";
			if (var_iterator->second.type == "mat4") // mat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != float";
			}
			else if (var_iterator->second.type == "dmat4") // dmat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != double";
			}
			else
			{
				function_definition += " != ";
				function_definition += var_iterator->second.type;
			}
			function_definition += "(((a*32u)+(b*16u)+(c*8u)+(d*4u)+(e*2u)+f))) {return false;}\n";
			function_definition += iteration_loop_end;
			function_definition += "\n    return true;\n";
			function_definition += "}\n\n"
								   "subroutine(out_routine_type) bool new_routine(";
			function_definition += var_iterator->second.type;
			function_definition += " x[2][2][2][2][2][2], out ";
			function_definition += var_iterator->second.type;
			function_definition += " y[2][2][2][2][2][2])\n{\n";
			function_definition += iteration_loop_start;
			function_definition +=
				"                                   y[a][b][c][d][e][f] = " + var_iterator->second.type + "(321);\n";
			function_definition += iteration_loop_end;
			function_definition += "\n";
			function_definition += iteration_loop_start;
			function_definition += "                                   if(x[a][b][c][d][e][f]";
			if (var_iterator->second.type == "mat4") // mat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != float";
			}
			else if (var_iterator->second.type == "dmat4") // dmat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != double";
			}
			else
			{
				function_definition += " != ";
				function_definition += var_iterator->second.type;
			}
			function_definition += "(((a*32u)+(b*16u)+(c*8u)+(d*4u)+(e*2u)+f))) {return false;}\n";
			function_definition += iteration_loop_end;
			function_definition += "\n    return true;\n";
			function_definition += "}\n\n"
								   "// Subroutine uniform\n"
								   "subroutine uniform out_routine_type routine;\n";

			function_use += "    " + var_iterator->second.type + " z[2][2][2][2][2][2];\n";
			function_use += iteration_loop_start;
			function_use += "                                   z[a][b][c][d][e][f] = ";
			function_use += var_iterator->second.type;
			function_use += "(((a*32u)+(b*16u)+(c*8u)+(d*4u)+(e*2u)+f));\n";
			function_use += iteration_loop_end;

			verification = "    float result = 0.0;\n"
						   "    if(routine(z, z) == true)\n"
						   "    {\n"
						   "        result = 1.0;\n"
						   "    }\n"
						   "    else\n"
						   "    {\n"
						   "        result = 0.5;\n"
						   "    }\n";

			if (false == test_compute)
			{
				this->execute_draw_test(tested_shader_type, function_definition, function_use, verification, false,
										false);
				this->execute_draw_test(tested_shader_type, function_definition, function_use, verification, true,
										false);
			}
			else
			{
				this->execute_dispatch_test(tested_shader_type, function_definition, function_use, verification, false,
											false);
				this->execute_dispatch_test(tested_shader_type, function_definition, function_use, verification, true,
											false);
			}

			/* Deallocate any resources used. */
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}